

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O0

void __thiscall
TPZTransfer<long_double>::TransferResidual
          (TPZTransfer<long_double> *this,TPZFMatrix<long_double> *fine,
          TPZFMatrix<long_double> *coarse)

{
  longdouble lVar1;
  int iVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  int64_t iVar6;
  TPZBaseMatrix *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZFMatrix<long_double> *in_RDI;
  unkbyte10 in_ST0;
  unkbyte10 in_ST1;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  unkbyte10 in_ST4;
  unkbyte10 in_ST5;
  unkbyte10 in_ST6;
  unkbyte10 in_ST7;
  int c_1;
  int i_1;
  int c;
  int i;
  TPZFMatrix<long_double> tempfine;
  TPZFMatrix<long_double> tempcoarse;
  int thisc;
  int thisr;
  int ncc;
  int nrc;
  int ncf;
  int nrf;
  int iv;
  longdouble *in_stack_fffffffffffffe50;
  longdouble *in_stack_fffffffffffffe58;
  TPZFMatrix<long_double> *in_stack_fffffffffffffe60;
  undefined4 local_194;
  undefined6 in_stack_fffffffffffffe70;
  undefined2 in_stack_fffffffffffffe76;
  long in_stack_fffffffffffffe78;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  int in_stack_fffffffffffffeac;
  TPZFMatrix<long_double> *in_stack_fffffffffffffeb0;
  TPZFMatrix<long_double> *in_stack_fffffffffffffeb8;
  TPZTransfer<long_double> *in_stack_fffffffffffffec0;
  int local_1c;
  
  TPZBaseMatrix::Rows(in_RSI);
  iVar3 = TPZBaseMatrix::Cols(in_RSI);
  iVar2 = (int)iVar3;
  iVar3 = TPZBaseMatrix::Rows(in_RDX);
  iVar4 = TPZBaseMatrix::Cols(in_RDX);
  iVar5 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
  iVar6 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDI);
  if ((int)iVar4 == iVar2) {
    in_stack_fffffffffffffe78 = (long)(int)iVar3;
    iVar3 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDI);
    if (in_stack_fffffffffffffe78 ==
        iVar3 * *(int *)&(in_RDI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.field_0x1c)
    goto LAB_011cc979;
  }
  iVar3 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDI);
  (*(in_RDX->super_TPZSavable)._vptr_TPZSavable[0xe])
            (in_RDX,(long)((int)iVar3 *
                          *(int *)&(in_RDI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.
                                   field_0x1c),(long)iVar2);
LAB_011cc979:
  if (*(int *)&(in_RDI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.field_0x1c == 1) {
    MultiplyScalar(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                   in_stack_fffffffffffffeac);
  }
  else {
    for (local_1c = 0;
        local_1c < *(int *)&(in_RDI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.field_0x1c;
        local_1c = local_1c + 1) {
      TPZFMatrix<long_double>::TPZFMatrix
                (in_RDI,in_stack_fffffffffffffe78,
                 CONCAT26(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70));
      TPZFMatrix<long_double>::TPZFMatrix
                (in_RDI,in_stack_fffffffffffffe78,
                 CONCAT26(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70));
      for (local_168 = 0; local_168 < (int)iVar6; local_168 = local_168 + 1) {
        for (local_16c = 0; local_16c < iVar2; local_16c = local_16c + 1) {
          (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x24])
                    (in_RSI,(long)(local_1c +
                                  local_168 *
                                  *(int *)&(in_RDI->super_TPZMatrix<long_double>).
                                           super_TPZBaseMatrix.field_0x1c),(long)local_16c);
          local_194 = (undefined4)in_ST0;
          in_stack_fffffffffffffe70 = (undefined6)((unkuint10)in_ST0 >> 0x20);
          in_stack_fffffffffffffe60 =
               (TPZFMatrix<long_double> *)
               TPZFMatrix<long_double>::operator()
                         (in_stack_fffffffffffffe60,(int64_t)in_stack_fffffffffffffe58,
                          (int64_t)in_stack_fffffffffffffe50);
          *(unkuint10 *)
           &(in_stack_fffffffffffffe60->super_TPZMatrix<long_double>).super_TPZBaseMatrix =
               CONCAT64(in_stack_fffffffffffffe70,local_194);
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
          in_ST5 = in_ST6;
          in_ST6 = in_ST7;
        }
      }
      MultiplyScalar(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                     in_stack_fffffffffffffeac);
      for (local_170 = 0; local_170 < (int)iVar5; local_170 = local_170 + 1) {
        for (local_174 = 0; local_174 < iVar2; local_174 = local_174 + 1) {
          in_stack_fffffffffffffe58 =
               TPZFMatrix<long_double>::operator()
                         (in_stack_fffffffffffffe60,(int64_t)in_stack_fffffffffffffe58,
                          (int64_t)in_stack_fffffffffffffe50);
          lVar1 = *in_stack_fffffffffffffe58;
          in_stack_fffffffffffffe50 =
               TPZFMatrix<long_double>::operator()
                         (in_stack_fffffffffffffe60,(int64_t)in_stack_fffffffffffffe58,
                          (int64_t)in_stack_fffffffffffffe50);
          *in_stack_fffffffffffffe50 = lVar1;
          in_ST7 = in_ST6;
        }
      }
      TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x11ccbc2);
      TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x11ccbcf);
    }
  }
  return;
}

Assistant:

void TPZTransfer<TVar>::TransferResidual(const TPZFMatrix<TVar> &fine, TPZFMatrix<TVar> &coarse){
	int iv;
	int nrf = fine.Rows();
	int ncf = fine.Cols();
	int nrc = coarse.Rows();
	int ncc = coarse.Cols();
    int thisr = this->Rows();
    int thisc = this->Cols();
	if(ncc != ncf || nrc != this->Cols()*fNTVarVar) {
		ncc = ncf;
		nrc = this->Cols()*fNTVarVar;
		coarse.Redim(nrc,ncf);
	}
    if (fNTVarVar == 1) {
        MultiplyScalar(fine,coarse,1);
    }
    else
    {
        for(iv=0; iv<fNTVarVar; iv++) {
            TPZFMatrix<TVar> tempcoarse(thisr,ncc), tempfine(thisc,ncf);
            for (int i=0; i<thisc; i++) {
                for (int c=0; c<ncf; c++) {
                    tempfine(i,c) = fine.GetVal(iv+i*fNTVarVar,c);
                    
                }
            }
            MultiplyScalar(tempfine, tempcoarse, 1);
            for (int i=0; i<thisr; i++) {
                for (int c=0; c<ncf; c++) {
                    coarse(iv+i*fNTVarVar,c) = tempcoarse(i,c);
                    
                }
            }
        }
    }

}